

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O0

bool __thiscall cppurses::Text_display::paint_event(Text_display *this)

{
  anon_class_24_3_a89f0314 __f;
  bool bVar1;
  size_t sVar2;
  size_type sVar3;
  size_t sVar4;
  anon_class_24_3_a89f0314 local_b8;
  Line_info *local_a0;
  Painter *local_98;
  size_t *local_90;
  Line_info *local_88;
  Line_info *local_80;
  Line_info *local_78;
  __normal_iterator<cppurses::Text_display::Line_info_*,_std::vector<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>_>
  local_70;
  iterator end;
  __normal_iterator<cppurses::Text_display::Line_info_*,_std::vector<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>_>
  local_60;
  __normal_iterator<cppurses::Text_display::Line_info_*,_std::vector<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>_>
  begin;
  anon_class_24_3_a89f0314 paint;
  size_t line_n;
  Painter p;
  Text_display *this_local;
  
  p.staged_changes_ = (Screen_descriptor *)this;
  Painter::Painter((Painter *)&line_n,&this->super_Widget);
  paint.this = (Text_display *)0x0;
  begin._M_current = (Line_info *)&line_n;
  paint.p = (Painter *)&paint.this;
  paint.line_n = (size_t *)this;
  end = std::
        begin<std::vector<cppurses::Text_display::Line_info,std::allocator<cppurses::Text_display::Line_info>>>
                  (&this->display_state_);
  sVar2 = top_line(this);
  local_60 = __gnu_cxx::
             __normal_iterator<cppurses::Text_display::Line_info_*,_std::vector<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>_>
             ::operator+(&end,sVar2);
  local_70._M_current =
       (Line_info *)
       std::
       end<std::vector<cppurses::Text_display::Line_info,std::allocator<cppurses::Text_display::Line_info>>>
                 (&this->display_state_);
  sVar3 = std::
          vector<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
          ::size(&this->display_state_);
  sVar2 = top_line(this);
  sVar4 = Widget::height(&this->super_Widget);
  if (sVar2 + sVar4 < sVar3) {
    sVar2 = Widget::height(&this->super_Widget);
    local_78 = (Line_info *)
               __gnu_cxx::
               __normal_iterator<cppurses::Text_display::Line_info_*,_std::vector<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>_>
               ::operator+(&local_60,sVar2);
    local_70 = (__normal_iterator<cppurses::Text_display::Line_info_*,_std::vector<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>_>
                )local_78;
  }
  sVar2 = top_line(this);
  sVar3 = std::
          vector<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
          ::size(&this->display_state_);
  if (sVar2 < sVar3) {
    local_80 = local_60._M_current;
    local_88 = local_70._M_current;
    local_a0 = begin._M_current;
    local_98 = paint.p;
    local_90 = paint.line_n;
    __f.line_n = (size_t *)paint.p;
    __f.p = (Painter *)begin._M_current;
    __f.this = (Text_display *)paint.line_n;
    std::
    for_each<__gnu_cxx::__normal_iterator<cppurses::Text_display::Line_info*,std::vector<cppurses::Text_display::Line_info,std::allocator<cppurses::Text_display::Line_info>>>,cppurses::Text_display::paint_event()::__0>
              (&local_b8,local_60,local_70,__f);
  }
  bVar1 = Widget::paint_event(&this->super_Widget);
  return bVar1;
}

Assistant:

bool Text_display::paint_event() {
    Painter p{*this};
    std::size_t line_n{0};
    auto paint = [&p, &line_n, this](const Line_info& line) {
        auto sub_begin = std::begin(this->contents_) + line.start_index;
        auto sub_end = sub_begin + line.length;
        std::size_t start{0};
        switch (alignment_) {
            case Alignment::Left:
                start = 0;
                break;
            case Alignment::Center:
                start = (this->width() - line.length) / 2;
                break;
            case Alignment::Right:
                start = this->width() - line.length;
                break;
        }
        p.put(Glyph_string(sub_begin, sub_end), start, line_n++);
    };
    auto begin = std::begin(display_state_) + this->top_line();
    auto end = std::end(display_state_);
    if (display_state_.size() > this->top_line() + this->height()) {
        end = begin + this->height();  // maybe make this the initial value?
    }
    if (this->top_line() < display_state_.size()) {
        std::for_each(begin, end, paint);
    }
    return Widget::paint_event();
}